

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PeleLM.cpp
# Opt level: O0

void __thiscall PeleLM::velocity_diffusion_update(PeleLM *this,Real dt)

{
  int *piVar1;
  Print *pPVar2;
  NavierStokesBase *this_00;
  long *in_RDI;
  double in_XMM0_Qa;
  MultiFab **in_stack_00000100;
  int in_stack_0000010c;
  MultiFab *in_stack_00000110;
  int in_stack_0000011c;
  MultiFab *in_stack_00000120;
  Real in_stack_00000128;
  Real in_stack_00000130;
  Diffusion *in_stack_00000138;
  MultiFab *in_stack_00000150;
  MultiFab **in_stack_00000158;
  MultiFab *in_stack_00000160;
  int in_stack_00000168;
  Real run_time;
  int IOProc;
  int betaComp;
  int rhsComp;
  MultiFab **betanp1;
  MultiFab **betan;
  FluxBoxes fb_betanp1;
  FluxBoxes fb_betan;
  MultiFab *delta_rhs;
  int rho_flag;
  Real time;
  Real strt_time;
  AmrLevel *in_stack_fffffffffffffd58;
  char (*x) [49];
  Vector<amrex::StateData,_std::allocator<amrex::StateData>_> *in_stack_fffffffffffffd60;
  undefined4 in_stack_fffffffffffffd70;
  undefined4 in_stack_fffffffffffffd74;
  ostream *in_stack_fffffffffffffd88;
  Print *in_stack_fffffffffffffd90;
  Print *this_01;
  double local_88;
  int local_7c;
  undefined4 local_78;
  undefined4 local_74;
  FluxBoxes local_50;
  FluxBoxes local_48;
  long *local_40;
  undefined4 local_34;
  Real local_30;
  double local_28;
  double local_20;
  
  local_20 = in_XMM0_Qa;
  piVar1 = amrex::Vector<int,_std::allocator<int>_>::operator[]
                     ((Vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffd60,
                      (size_type)in_stack_fffffffffffffd58);
  if (*piVar1 != 0) {
    local_28 = amrex::ParallelDescriptor::second();
    amrex::Vector<amrex::StateData,_std::allocator<amrex::StateData>_>::operator[]
              (in_stack_fffffffffffffd60,(size_type)in_stack_fffffffffffffd58);
    local_30 = amrex::StateData::prevTime
                         ((StateData *)CONCAT44(in_stack_fffffffffffffd74,in_stack_fffffffffffffd70)
                         );
    if (NavierStokesBase::do_mom_diff == 0) {
      local_34 = 1;
    }
    else {
      local_34 = 3;
    }
    local_40 = (long *)0x0;
    FluxBoxes::FluxBoxes
              ((FluxBoxes *)in_stack_fffffffffffffd60,in_stack_fffffffffffffd58,0,0x2aa2f4);
    FluxBoxes::FluxBoxes
              ((FluxBoxes *)in_stack_fffffffffffffd60,in_stack_fffffffffffffd58,0,0x2aa317);
    pPVar2 = (Print *)FluxBoxes::get(&local_48);
    this_01 = pPVar2;
    this_00 = (NavierStokesBase *)FluxBoxes::get(&local_50);
    (**(code **)(*in_RDI + 400))(local_30,in_RDI,pPVar2);
    (**(code **)(*in_RDI + 400))(local_30 + local_20,in_RDI,this_00);
    local_74 = 0;
    local_78 = 0;
    NavierStokesBase::get_rho_half_time(this_00);
    x = (char (*) [49])in_RDI[0x182];
    Diffusion::diffuse_velocity
              (in_stack_00000138,in_stack_00000130,in_stack_00000128,in_stack_00000120,
               in_stack_0000011c,in_stack_00000110,in_stack_0000010c,in_stack_00000100,
               in_stack_00000150,in_stack_00000158,in_stack_00000160,in_stack_00000168);
    if (local_40 != (long *)0x0) {
      (**(code **)(*local_40 + 8))();
    }
    if (2 < NavierStokesBase::verbose) {
      local_7c = amrex::ParallelDescriptor::IOProcessorNumber();
      local_88 = amrex::ParallelDescriptor::second();
      local_88 = local_88 - local_28;
      amrex::ParallelDescriptor::ReduceRealMax<double>(&local_88,local_7c);
      amrex::OutStream();
      amrex::Print::Print(in_stack_fffffffffffffd90,in_stack_fffffffffffffd88);
      amrex::Print::operator<<((Print *)this_00,x);
      amrex::Print::operator<<((Print *)this_00,(int *)x);
      amrex::Print::operator<<((Print *)this_00,(char (*) [9])x);
      amrex::Print::operator<<((Print *)this_00,(double *)x);
      amrex::Print::operator<<((Print *)this_00,*x);
      amrex::Print::~Print(this_01);
    }
    FluxBoxes::~FluxBoxes((FluxBoxes *)0x2aa5f9);
    FluxBoxes::~FluxBoxes((FluxBoxes *)0x2aa606);
  }
  return;
}

Assistant:

void
PeleLM::velocity_diffusion_update (Real dt)
{
   BL_PROFILE("PLM::velocity_diffusion_update()");
   //
   // Do implicit c-n solve for velocity
   // compute the viscous forcing
   // do following except at initial iteration--rbp, per jbb
   //
   if (is_diffusive[Xvel])
   {
      const Real strt_time = ParallelDescriptor::second();

      const Real time = state[State_Type].prevTime();

      int rho_flag;
      if (do_mom_diff == 0)
      {
         rho_flag = 1;
      }
      else
      {
         rho_flag = 3;
      }

      MultiFab *delta_rhs = 0;

      FluxBoxes fb_betan(this,1,0);
      FluxBoxes fb_betanp1(this,1,0);
      MultiFab** betan = fb_betan.get();
      MultiFab** betanp1 = fb_betanp1.get();
      getViscosity(betan, time);
      getViscosity(betanp1, time+dt);

      int rhsComp  = 0;
      int betaComp = 0;
      diffusion->diffuse_velocity(dt,be_cn_theta,get_rho_half_time(),rho_flag,
                                  delta_rhs,rhsComp,betan,viscn_cc,
                                  betanp1,viscnp1_cc,betaComp);

      delete delta_rhs;

      if (verbose > 2)
      {
        const int IOProc   = ParallelDescriptor::IOProcessorNumber();
        Real      run_time = ParallelDescriptor::second() - strt_time;

        ParallelDescriptor::ReduceRealMax(run_time,IOProc);

        amrex::Print() << "      PeleLM::velocity_diffusion_update(): lev: " << level
                       << ", time: " << run_time << '\n';
      }
  }
}